

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

bool deqp::gls::TextureStateQueryTests::isLegalTesterForTarget(GLenum target,TesterType tester)

{
  if (((target == 0x806f) ||
      (tester != TESTER_TEXTURE_WRAP_R && tester != TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER)) &&
     (((target & 0xfffffffd) != 0x9100 ||
      ((0x2c < tester - TESTER_TEXTURE_WRAP_S ||
       ((0x1e4048049249U >> ((ulong)(tester - TESTER_TEXTURE_WRAP_S) & 0x3f) & 1) == 0)))))) {
    return target != 0x8c2a;
  }
  return false;
}

Assistant:

bool isLegalTesterForTarget (glw::GLenum target, TesterType tester)
{
	// no 3d filtering on 2d targets
	if ((tester == TESTER_TEXTURE_WRAP_R || tester == TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER) &&  target != GL_TEXTURE_3D)
		return false;

	// no sampling on multisample
	if (isMultisampleTarget(target) && isSamplerStateTester(tester))
		return false;

	// no states in buffer
	if (target == GL_TEXTURE_BUFFER)
		return false;

	return true;
}